

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool string_storeat(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_object_t *pgVar2;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_value_t value_03;
  uint32_t uVar3;
  gravity_fiber_t *pgVar4;
  uint local_409c;
  int i;
  char local_4088 [8];
  char _buffer_3 [4096];
  char local_3078 [8];
  char _buffer_2 [4096];
  int32_t index;
  gravity_string_t *value;
  char local_2058 [8];
  char _buffer_1 [4096];
  char local_1048 [8];
  char _buffer [4096];
  gravity_value_t idxvalue;
  gravity_string_t *string;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  if (args[1].isa == gravity_class_int) {
    if (args[2].isa == gravity_class_string) {
      pgVar2 = args[2].field_1.p;
      _buffer_2._4092_4_ = (undefined4)args[1].field_1.n;
      if ((int)_buffer_2._4092_4_ < 0) {
        _buffer_2._4092_4_ = *(int *)((long)&pgVar1->identifier + 4) + _buffer_2._4092_4_;
      }
      if (((int)_buffer_2._4092_4_ < 0) ||
         (*(uint *)((long)&pgVar1->identifier + 4) <= (uint)_buffer_2._4092_4_)) {
        snprintf(local_3078,0x1000,"Out of bounds error: index %d beyond bounds 0...%d",
                 (ulong)(uint)_buffer_2._4092_4_,
                 (ulong)(*(int *)((long)&pgVar1->identifier + 4) - 1));
        pgVar4 = gravity_vm_fiber(vm);
        gravity_fiber_seterror(pgVar4,local_3078);
        _buffer_3._4088_8_ = gravity_class_null;
        value_01.field_1.n = 0;
        value_01.isa = gravity_class_null;
        gravity_vm_setslot(vm,value_01,rindex);
        vm_local._7_1_ = false;
      }
      else if ((_buffer_2._4092_4_ + *(int *)((long)&pgVar2->identifier + 4)) - 1U <
               *(uint *)((long)&pgVar1->identifier + 4)) {
        local_409c._0_1_ = _buffer_2[0xffc];
        local_409c._1_1_ = _buffer_2[0xffd];
        local_409c._2_1_ = _buffer_2[0xffe];
        local_409c._3_1_ = _buffer_2[0xfff];
        for (; local_409c < (uint)(_buffer_2._4092_4_ + *(int *)((long)&pgVar2->identifier + 4));
            local_409c = local_409c + 1) {
          *(undefined1 *)((long)&pgVar1->objclass->isa + (long)(int)local_409c) =
               *(undefined1 *)
                ((long)&pgVar2->objclass->isa + (long)(int)(local_409c - _buffer_2._4092_4_));
        }
        uVar3 = gravity_hash_compute_buffer
                          ((char *)pgVar1->objclass,*(uint32_t *)((long)&pgVar1->identifier + 4));
        *(uint32_t *)&pgVar1->identifier = uVar3;
        vm_local._7_1_ = true;
      }
      else {
        snprintf(local_4088,0x1000,
                 "Out of bounds error: End of inserted string exceeds the length of the initial string"
                );
        pgVar4 = gravity_vm_fiber(vm);
        gravity_fiber_seterror(pgVar4,local_4088);
        value_00.field_1.n = 0;
        value_00.isa = gravity_class_null;
        gravity_vm_setslot(vm,value_00,rindex);
        vm_local._7_1_ = false;
      }
    }
    else {
      snprintf(local_2058,0x1000,"A string needs to be assigned to a string index");
      pgVar4 = gravity_vm_fiber(vm);
      gravity_fiber_seterror(pgVar4,local_2058);
      value_02.field_1.n = 0;
      value_02.isa = gravity_class_null;
      gravity_vm_setslot(vm,value_02,rindex);
      vm_local._7_1_ = false;
    }
  }
  else {
    snprintf(local_1048,0x1000,"An integer index is required to access a string item.");
    pgVar4 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar4,local_1048);
    _buffer_1._4088_8_ = gravity_class_null;
    value_03.field_1.n = 0;
    value_03.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_03,rindex);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool string_storeat (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs, rindex)

    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));
    gravity_value_t idxvalue = GET_VALUE(1);
    if (!VALUE_ISA_INT(idxvalue)) RETURN_ERROR("An integer index is required to access a string item.");
    if (!VALUE_ISA_STRING(GET_VALUE(2))) RETURN_ERROR("A string needs to be assigned to a string index");

    gravity_string_t *value = VALUE_AS_STRING(GET_VALUE(2));
    register int32_t index = (int32_t)VALUE_AS_INT(idxvalue);

    if (index < 0) index = string->len + index;
    if (index < 0 || index >= string->len) RETURN_ERROR("Out of bounds error: index %d beyond bounds 0...%d", index, string->len-1);
    if (index+value->len - 1 >= string->len) RETURN_ERROR("Out of bounds error: End of inserted string exceeds the length of the initial string");

    // this code is not UTF-8 safe
    for (int i = index; i < index+value->len; ++i) {
        string->s[i] = value->s[i-index];
    }

    // characters inside string changed so we need to re-compute hash
    string->hash = gravity_hash_compute_buffer((const char *)string->s, string->len);

    RETURN_NOVALUE();
}